

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall Clasp::MinimizeBuilder::CmpWeight::operator()(CmpWeight *this,MLit *lhs,MLit *rhs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  pointer pLVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  
  uVar1 = lhs->weight;
  if (this->weights == (WeightVec *)0x0) {
    uVar2 = rhs->weight;
    bVar11 = SBORROW4(uVar1,uVar2);
    bVar10 = (int)(uVar1 - uVar2) < 0;
    bVar9 = uVar1 == uVar2;
  }
  else {
    pLVar6 = (this->weights->ebo_).buf;
    uVar7 = (ulong)(uint)rhs->weight;
    while( true ) {
      uVar8 = *(uint *)(pLVar6 + uVar1) & 0x7fffffff;
      uVar2 = *(uint *)(pLVar6 + uVar7);
      if (uVar8 != (uVar2 & 0x7fffffff)) break;
      iVar3 = pLVar6[uVar7].weight;
      iVar4 = pLVar6[uVar1].weight;
      bVar11 = SBORROW4(iVar4,iVar3);
      bVar10 = iVar4 - iVar3 < 0;
      bVar9 = iVar4 == iVar3;
      if (!bVar9) goto LAB_0014c845;
      if (-1 < (int)*(uint *)(pLVar6 + uVar1)) {
        if (-1 < (int)uVar2) {
          return false;
        }
        bVar5 = (byte)((uint)pLVar6[uVar7 + 1].weight >> 0x18);
        goto LAB_0014c853;
      }
      if (-1 < (int)uVar2) {
        bVar11 = false;
        bVar10 = pLVar6[(ulong)uVar1 + 1].weight < 0;
        bVar9 = pLVar6[(ulong)uVar1 + 1].weight == 0;
        goto LAB_0014c845;
      }
      pLVar6 = pLVar6 + 1;
    }
    if ((uVar2 & 0x7fffffff) <= uVar8) {
      bVar5 = (byte)((uint)pLVar6[uVar7].weight >> 0x18);
LAB_0014c853:
      return (bool)(bVar5 >> 7);
    }
    bVar11 = false;
    bVar10 = pLVar6[uVar1].weight < 0;
    bVar9 = pLVar6[uVar1].weight == 0;
  }
LAB_0014c845:
  return !bVar9 && bVar11 == bVar10;
}

Assistant:

bool MinimizeBuilder::CmpWeight::operator()(const MLit& lhs, const MLit& rhs) const {
	if (!weights) { return lhs.weight > rhs.weight; }
	const SharedData::LevelWeight* wLhs = &(*weights)[lhs.weight];
	const SharedData::LevelWeight* wRhs = &(*weights)[rhs.weight];
	for (;; ++wLhs, ++wRhs) {
		if (wLhs->level != wRhs->level)  {
			return wLhs->level < wRhs->level ? wLhs->weight > 0 : 0 > wRhs->weight;
		}
		if (wLhs->weight != wRhs->weight){ return wLhs->weight > wRhs->weight; }
		if (!wLhs->next) { return wRhs->next && (++wRhs)->weight < 0; }
		if (!wRhs->next) { ++wLhs; break; }
	}
	return wLhs->weight > 0;
}